

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::
FixedGenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
::doApply(IRet *__return_storage_ptr__,
         FixedGenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
         *this,EvalContext *ctx,IArgs *iargs)

{
  bool bVar1;
  long *plVar2;
  long lVar3;
  bool bVar4;
  undefined8 local_68;
  double dStack_60;
  double local_58;
  Interval *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Void *local_38;
  
  lVar3 = 0;
  __return_storage_ptr__->m_data[0].m_hasNaN = false;
  *(undefined4 *)&__return_storage_ptr__->m_data[0].m_lo = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_data[0].m_lo + 4) = 0x7ff00000;
  *(undefined4 *)&__return_storage_ptr__->m_data[0].m_hi = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_data[0].m_hi + 4) = 0xfff00000;
  __return_storage_ptr__->m_data[1].m_hasNaN = false;
  *(undefined4 *)&__return_storage_ptr__->m_data[1].m_lo = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_data[1].m_lo + 4) = 0x7ff00000;
  *(undefined4 *)&__return_storage_ptr__->m_data[1].m_hi = 0;
  *(undefined4 *)((long)&__return_storage_ptr__->m_data[1].m_hi + 4) = 0xfff00000;
  plVar2 = (long *)(**(code **)(*(long *)this + 0x58))(this);
  bVar1 = true;
  do {
    bVar4 = bVar1;
    local_50 = iargs->a->m_data + lVar3;
    local_38 = iargs->d;
    local_48 = *(undefined4 *)&iargs->b;
    uStack_44 = *(undefined4 *)((long)&iargs->b + 4);
    uStack_40 = *(undefined4 *)&iargs->c;
    uStack_3c = *(undefined4 *)((long)&iargs->c + 4);
    (**(code **)(*plVar2 + 0x40))(&local_68,plVar2,ctx,&local_50);
    __return_storage_ptr__->m_data[lVar3].m_hi = local_58;
    *(undefined8 *)(__return_storage_ptr__->m_data + lVar3) = local_68;
    __return_storage_ptr__->m_data[lVar3].m_lo = dStack_60;
    lVar3 = 1;
    bVar1 = false;
  } while (bVar4);
  return __return_storage_ptr__;
}

Assistant:

IRet						doApply			(const EvalContext& ctx,
												 const IArgs&		iargs) const
	{
		IRet				ret;
		const Func<Sig_>&	func	= this->doGetScalarFunc();

		for (int ndx = 0; ndx < Size; ++ndx)
			ret[ndx] = func.apply(ctx, iargs.a[ndx], iargs.b, iargs.c[ndx], iargs.d[ndx]);

		return ret;
	}